

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O0

void __thiscall
cmMakefileProfilingData::cmMakefileProfilingData
          (cmMakefileProfilingData *this,string *profileStream)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  StreamWriter *__p;
  runtime_error *this_00;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>> local_68 [8];
  undefined1 local_60 [8];
  StreamWriterBuilder wbuilder;
  openmode omode;
  string *profileStream_local;
  cmMakefileProfilingData *this_local;
  
  std::ofstream::ofstream(this);
  std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
  unique_ptr<std::default_delete<Json::StreamWriter>,void>
            ((unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>> *)
             &this->JsonWriter);
  std::operator|(_S_out,_S_trunc);
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)this,_Var2);
  Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_60);
  __p = Json::StreamWriterBuilder::newStreamWriter((StreamWriterBuilder *)local_60);
  std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
  unique_ptr<std::default_delete<Json::StreamWriter>,void>(local_68,__p);
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::operator=
            (&this->JsonWriter,
             (unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> *)local_68);
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
            ((unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> *)local_68);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Unable to open: ",&local_a9);
    std::operator+(&local_88,&local_a8,profileStream);
    std::runtime_error::runtime_error(this_00,(string *)&local_88);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator<<((ostream *)this,"[");
  Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_60);
  return;
}

Assistant:

cmMakefileProfilingData::cmMakefileProfilingData(
  const std::string& profileStream)
{
  std::ios::openmode omode = std::ios::out | std::ios::trunc;
  this->ProfileStream.open(profileStream.c_str(), omode);
  Json::StreamWriterBuilder wbuilder;
  this->JsonWriter =
    std::unique_ptr<Json::StreamWriter>(wbuilder.newStreamWriter());
  if (!this->ProfileStream.good()) {
    throw std::runtime_error(std::string("Unable to open: ") + profileStream);
  }

  this->ProfileStream << "[";
}